

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::ReadnPixelsTest::verifyResults(ReadnPixelsTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  GLint error;
  undefined4 extraout_var;
  long lVar3;
  GLubyte pixelsValid [64];
  GLubyte pixelsInvalid [63];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = 0;
  (*this->m_pReadnPixels)(0,0,8,8,0x8d94,0x1401,0x40,pixelsValid);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"ReadnPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                  ,0x5f7);
  do {
    if (pixelsValid[lVar3] != 0xff) {
      return false;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x40);
  (*this->m_pReadnPixels)(0,0,8,8,0x8d94,0x1401,0x3f,pixelsInvalid);
  error = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  bVar1 = verifyError(this,error,0x502,"ReadnPixels [false positive]");
  return bVar1;
}

Assistant:

bool ReadnPixelsTest::verifyResults()
{
	static const GLuint height = 8;
	static const GLuint width  = 8;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	//Valid buffer size test
	const GLint bufSizeValid = width * height;
	GLubyte		pixelsValid[bufSizeValid];

	m_pReadnPixels(0, 0, width, height, GL_RED_INTEGER, GL_UNSIGNED_BYTE, bufSizeValid, pixelsValid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ReadnPixels");

	//Verify glReadnPixels result
	for (GLuint i = 0; i < width * height; ++i)
	{
		if (pixelsValid[i] != 255)
			return false;
	}

	//Invalid buffer size test
	const GLint bufSizeInvalid = width * height - 1;
	GLubyte		pixelsInvalid[bufSizeInvalid];

	m_pReadnPixels(0, 0, width, height, GL_RED_INTEGER, GL_UNSIGNED_BYTE, bufSizeInvalid, pixelsInvalid);
	if (!verifyError(gl.getError(), GL_INVALID_OPERATION, "ReadnPixels [false positive]"))
		return false;

	return true;
}